

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::TimezoneMinuteOperator>
               (interval_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  interval_t *piVar7;
  interval_t *piVar8;
  ValidityMask *unaff_R14;
  ValidityMask *unaff_R15;
  interval_t input;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_30;
  
  puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar5 == (unsigned_long *)0x0) {
    mask = unaff_R14;
    result_mask = unaff_R15;
    if (count != 0) goto LAB_00f63819;
    return;
  }
  if (!adds_nulls) goto LAB_00f6381e;
  (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
  local_30 = count;
  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
            ((duckdb *)&local_48,(unsigned_long **)mask,&local_30);
  p_Var3 = p_Stack_40;
  peVar2 = local_48;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
     p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                     (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
       (unsigned_long *)
       (pTVar4->owned_data).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
       ._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>;
LAB_00f63836:
  if (count + 0x3f < 0x40) {
    return;
  }
  puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar6 = 0;
  result_data = (long *)(interval_t *)0x0;
  do {
    if (puVar5 == (unsigned_long *)0x0) {
      ldata = (interval_t *)((long)result_data + 0x40);
      if (count <= (interval_t *)((long)result_data + 0x40)) {
        ldata = (interval_t *)count;
      }
LAB_00f63892:
      piVar7 = (interval_t *)result_data;
      if (result_data < ldata) break;
    }
    else {
      uVar1 = puVar5[uVar6];
      ldata = (interval_t *)((long)result_data + 0x40);
      if (count <= (interval_t *)((long)result_data + 0x40)) {
        ldata = (interval_t *)count;
      }
      if (uVar1 == 0xffffffffffffffff) goto LAB_00f63892;
      piVar7 = ldata;
      if ((uVar1 != 0) &&
         (piVar8 = (interval_t *)((long)ldata - (long)result_data),
         piVar7 = (interval_t *)result_data, result_data < ldata)) {
        result_data = (long *)0x0;
        do {
          if ((uVar1 >> ((ulong)result_data & 0x3f) & 1) != 0) goto LAB_00f63819;
          result_data = (long *)((long)&((interval_t *)result_data)->months + 1);
          piVar7 = ldata;
        } while (piVar8 != (interval_t *)result_data);
      }
    }
    uVar6 = uVar6 + 1;
    result_data = (long *)piVar7;
    if (uVar6 == count + 0x3f >> 6) {
      return;
    }
  } while( true );
LAB_00f63819:
  input.micros = (int64_t)result_data;
  input._0_8_ = ldata;
  puVar5 = (unsigned_long *)
           DatePart::TimezoneMinuteOperator::Operation<duckdb::interval_t,long>(input);
LAB_00f6381e:
  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar5;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
             &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
  (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
       (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
  goto LAB_00f63836;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}